

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O1

bool StreqExcept(char *a,char *b,char *except)

{
  char cVar1;
  char cVar2;
  size_t __n;
  void *pvVar3;
  
  __n = strlen(except);
  do {
    do {
      cVar1 = *a;
      pvVar3 = memchr(except,(int)cVar1,__n);
      a = a + 1;
    } while (pvVar3 != (void *)0x0);
    do {
      cVar2 = *b;
      pvVar3 = memchr(except,(int)cVar2,__n);
      b = b + 1;
    } while (pvVar3 != (void *)0x0);
  } while ((cVar1 == cVar2) && (cVar2 != '\0' || cVar1 != '\0'));
  return cVar2 == '\0' && cVar1 == '\0';
}

Assistant:

bool StreqExcept(const char* a, const char* b, const char* except) {
  const char* pa = a, *pb = b;
  const size_t exceptlen = strlen(except);
  while (1) {
    // Use memchr instead of strchr because strchr(foo, '\0') always fails
    while (memchr(except, *pa, exceptlen))  pa++;   // ignore "except" chars in a
    while (memchr(except, *pb, exceptlen))  pb++;   // ignore "except" chars in b
    if ((*pa == '\0') && (*pb == '\0'))
      return true;
    if (*pa++ != *pb++)                  // includes case where one is at \0
      return false;
  }
}